

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoTableGet(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *store;
  Result RVar1;
  RunResult RVar2;
  Value VVar3;
  Ref ref;
  Ptr table;
  Ptr local_68;
  string local_48;
  
  RefPtr<wabt::interp::Table>::RefPtr
            (&table,this->store_,
             (Ref)(this->inst_->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar3 = Pop(this);
  RVar1 = Table::Get(table.obj_,VVar3.field_0.i32_,&ref);
  if (RVar1.enum_ == Error) {
    store = this->store_;
    StringPrintf_abi_cxx11_
              (&local_48,"out of bounds table access: table.get at %u >= max value %u",
               VVar3.field_0.i64_ & 0xffffffff,
               (ulong)((long)((table.obj_)->elements_).
                             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)((table.obj_)->elements_).
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
    Trap::New(&local_68,store,&local_48,&this->frames_);
    out_trap->obj_ = local_68.obj_;
    out_trap->store_ = local_68.store_;
    out_trap->root_index_ = local_68.root_index_;
    local_68.obj_ = (Trap *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_68);
    std::__cxx11::string::_M_dispose();
    RVar2 = Trap;
  }
  else {
    Push(this,ref);
    RVar2 = Ok;
  }
  RefPtr<wabt::interp::Table>::reset(&table);
  return RVar2;
}

Assistant:

RunResult Thread::DoTableGet(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32]};
  auto index = Pop<u32>();
  Ref ref;
  TRAP_IF(Failed(table->Get(index, &ref)),
          StringPrintf(
              "out of bounds table access: table.get at %u >= max value %u",
              index, table->size()));
  Push(ref);
  return RunResult::Ok;
}